

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int string_is_numeric(char *value)

{
  size_t sVar1;
  ulong local_28;
  size_t i;
  size_t len;
  char *value_local;
  
  sVar1 = strlen(value);
  if (sVar1 == 0) {
    value_local._4_4_ = -0x14;
  }
  else if ((sVar1 == 1) && ((*value < '0' || ('9' < *value)))) {
    value_local._4_4_ = -0x14;
  }
  else if (((*value < '0') || ('9' < *value)) && ((*value != '-' && (*value != '+')))) {
    value_local._4_4_ = -0x14;
  }
  else {
    for (local_28 = 1; local_28 < sVar1; local_28 = local_28 + 1) {
      if ((value[local_28] < '0') || ('9' < value[local_28])) {
        return -0x14;
      }
    }
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

static int string_is_numeric (const char* value)
{
       size_t len = strlen(value);
       size_t i;

       if (len == 0) {
               return (ARCHIVE_WARN);
       }
       else if (len == 1 && !(value[0] >= '0' && value[0] <= '9')) {
               return (ARCHIVE_WARN);
       }
       else if (!(value[0] >= '0' && value[0] <= '9') &&
                value[0] != '-' && value[0] != '+') {
               return (ARCHIVE_WARN);
       }

       for (i = 1; i < len; i++) {
               if (!(value[i] >= '0' && value[i] <= '9')) {
                       return (ARCHIVE_WARN);
               }
       }

       return (ARCHIVE_OK);
}